

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_rsa.cc
# Opt level: O3

int pkey_rsa_verify(EVP_PKEY_CTX *ctx,uint8_t *sig,size_t siglen,uint8_t *tbs,size_t tbslen)

{
  RSA_PKEY_CTX *ctx_00;
  RSA *rsa;
  EVP_MD *md;
  int iVar1;
  int iVar2;
  int iVar3;
  size_t rslen;
  
  ctx_00 = (RSA_PKEY_CTX *)ctx->data;
  rsa = *(RSA **)&((EVP_PKEY *)ctx->pkey)->references;
  md = (EVP_MD *)ctx_00->md;
  if (md == (EVP_MD *)0x0) {
    iVar1 = EVP_PKEY_size((EVP_PKEY *)ctx->pkey);
    iVar2 = setup_tbuf(ctx_00,ctx);
    iVar3 = 0;
    if ((iVar2 != 0) &&
       (iVar1 = RSA_verify_raw(rsa,&rslen,ctx_00->tbuf,(long)iVar1,sig,siglen,ctx_00->pad_mode),
       iVar1 != 0)) {
      if ((rslen == tbslen) && (iVar1 = CRYPTO_memcmp(tbs,ctx_00->tbuf,tbslen), iVar1 == 0)) {
        iVar3 = 1;
      }
      else {
        iVar3 = 0;
        ERR_put_error(4,0,0x69,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_rsa.cc"
                      ,0xc4);
      }
    }
  }
  else if (ctx_00->pad_mode == 6) {
    iVar3 = RSA_verify_pss_mgf1(rsa,tbs,tbslen,(EVP_MD *)md,ctx_00->mgf1md,ctx_00->saltlen,sig,
                                siglen);
  }
  else {
    iVar3 = 0;
    if (ctx_00->pad_mode == 1) {
      iVar1 = EVP_MD_type(md);
      iVar1 = RSA_verify(iVar1,tbs,(uint)tbslen,sig,(uint)siglen,(RSA *)rsa);
      return iVar1;
    }
  }
  return iVar3;
}

Assistant:

static int pkey_rsa_verify(EVP_PKEY_CTX *ctx, const uint8_t *sig, size_t siglen,
                           const uint8_t *tbs, size_t tbslen) {
  RSA_PKEY_CTX *rctx = reinterpret_cast<RSA_PKEY_CTX *>(ctx->data);
  RSA *rsa = reinterpret_cast<RSA *>(ctx->pkey->pkey);

  if (rctx->md) {
    switch (rctx->pad_mode) {
      case RSA_PKCS1_PADDING:
        return RSA_verify(EVP_MD_type(rctx->md), tbs, tbslen, sig, siglen, rsa);

      case RSA_PKCS1_PSS_PADDING:
        return RSA_verify_pss_mgf1(rsa, tbs, tbslen, rctx->md, rctx->mgf1md,
                                   rctx->saltlen, sig, siglen);

      default:
        return 0;
    }
  }

  size_t rslen;
  const size_t key_len = EVP_PKEY_size(ctx->pkey);
  if (!setup_tbuf(rctx, ctx) ||
      !RSA_verify_raw(rsa, &rslen, rctx->tbuf, key_len, sig, siglen,
                      rctx->pad_mode)) {
    return 0;
  }
  if (rslen != tbslen || CRYPTO_memcmp(tbs, rctx->tbuf, rslen) != 0) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_BAD_SIGNATURE);
    return 0;
  }

  return 1;
}